

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

var __thiscall cs_impl::list_cs_ext::back(list_cs_ext *this,list *lst)

{
  _List_node_base *p_Var1;
  long *plVar2;
  allocator local_31;
  uint *local_30;
  long local_28;
  uint local_20;
  undefined4 uStack_1c;
  undefined4 uStack_18;
  undefined4 uStack_14;
  
  if ((lst->super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)lst) {
    p_Var1 = (lst->super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl._M_node.
             super__List_node_base._M_prev[1]._M_next;
    if (p_Var1 != (_List_node_base *)0x0) {
      p_Var1->_M_prev = (_List_node_base *)((long)&p_Var1->_M_prev->_M_next + 1);
    }
    *(_List_node_base **)this = p_Var1;
    return (var)(proxy *)this;
  }
  plVar2 = (long *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string((string *)&local_30,"Call back() on empty list.",&local_31);
  *plVar2 = (long)(plVar2 + 2);
  if (local_30 == &local_20) {
    *(uint *)(plVar2 + 2) = local_20;
    *(undefined4 *)((long)plVar2 + 0x14) = uStack_1c;
    *(undefined4 *)(plVar2 + 3) = uStack_18;
    *(undefined4 *)((long)plVar2 + 0x1c) = uStack_14;
  }
  else {
    *plVar2 = (long)local_30;
    plVar2[2] = CONCAT44(uStack_1c,local_20);
  }
  plVar2[1] = local_28;
  local_28 = 0;
  local_20 = local_20 & 0xffffff00;
  local_30 = &local_20;
  __cxa_throw(plVar2,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
}

Assistant:

bool is_dst(const std::tm &t)
		{
			return t.tm_isdst;
		}